

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void tests::hylo_performance(void)

{
  pointer ppNVar1;
  double dVar2;
  NS *pNVar3;
  N *this;
  N *this_00;
  N *pNVar4;
  ostream *poVar5;
  vector<N_*,_std::allocator<N_*>_> local_88;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  pNVar3 = (NS *)operator_new(0x18);
  (pNVar3->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar3->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar3->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this = (N *)N::operator_new(0x78,pNVar3);
  N::N<char_const*>(this,"Left");
  this_00 = (N *)N::operator_new(0x78,pNVar3);
  N::N<char_const*>(this_00,"Right");
  std::chrono::_V2::system_clock::now();
  pNVar4 = (N *)N::operator_new(0x78,pNVar3);
  (pNVar4->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar4->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar4->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pNVar4->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar4->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar4->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pNVar4->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar4->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar4->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined4 *)
   &(pNVar4->data).
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>._M_u = 1000000
  ;
  *(__index_type *)
   ((long)&(pNVar4->data).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*> + 0x20)
       = '\x01';
  coalg::rand_btree((CoAlg<int> *)&local_50,pNVar3,this,this_00);
  pNVar4 = N::ana<int>(pNVar4,(CoAlg<int> *)&local_50);
  alg::btree_avg(this,this_00);
  local_88.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_88.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dVar2 = N::histo<double>(pNVar4,(Alg<double> *)&local_70,&local_88);
  if (local_88.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  std::chrono::_V2::system_clock::now();
  poVar5 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  pNVar3 = NS::clear(pNVar3);
  if ((pNVar3 != (NS *)0x0) &&
     (ppNVar1 = (pNVar3->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                super__Vector_impl_data._M_start, ppNVar1 != (pointer)0x0)) {
    operator_delete(ppNVar1,(long)(pNVar3->_os).super__Vector_base<N_*,_std::allocator<N_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppNVar1)
    ;
  }
  operator_delete(pNVar3,0x18);
  return;
}

Assistant:

void hylo_performance() {
        //             ana       cata      hylo
        // C++ T      6159555   3626070    9497513
        // Python    33156637  10476905   46028639
        // Python T 697323327 668245419 1467391795
        auto expr = new NS();
        auto left = new(expr) N("Left"), right = new(expr) N("Right");

        auto start = high_resolution_clock::now();
        auto res = (new(expr) N(1000000))->
                ana(coalg::rand_btree(expr, left, right))->
                histo(alg::btree_avg(left, right));
        auto stop = high_resolution_clock::now();

        auto duration = duration_cast<nanoseconds>(stop - start);
        cout << res << ", " << duration.count() << endl;

        delete expr->clear();
    }